

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int remove_ext_list(nifti_image *nim,char **elist,int len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  size_t __nmemb;
  
  uVar7 = nim->num_ext;
  if ((int)uVar7 < len) {
    fprintf(_stderr,"** cannot remove %d exts from image \'%s\' with only %d\n",(ulong)(uint)len,
            nim->fname,(ulong)uVar7);
  }
  else {
    if (len < 1) {
      pcVar10 = "** REL: (%d) no extensions to remove?\n";
      uVar9 = (ulong)(uint)len;
    }
    else {
      iVar5 = atoi(*elist);
      if (iVar5 == -1) {
        if (1 < g_debug) {
          fprintf(_stderr,"+d removing ALL (%d) extensions from \'%s\'\n",(ulong)uVar7,nim->fname);
        }
        nifti_free_extensions(nim);
        return 0;
      }
      if (2 < g_debug) {
        fprintf(_stderr,"+d removing %d exts from \'%s\'\n",(ulong)(uint)len,nim->fname);
      }
      uVar7 = nim->num_ext;
      __nmemb = (size_t)(int)uVar7;
      __ptr = calloc(__nmemb,4);
      if (__ptr != (void *)0x0) {
        uVar9 = 1;
        if (1 < len) {
          uVar9 = (ulong)(uint)len;
        }
        uVar11 = 0;
        while ((uVar6 = atoi(elist[uVar11]), -1 < (int)uVar6 && ((int)uVar6 < (int)uVar7))) {
          if (*(int *)((long)__ptr + (ulong)uVar6 * 4) != 0) {
            fprintf(_stderr,"** ext #%d (= %d) is a duplicate",uVar11 & 0xffffffff,(ulong)uVar6);
            goto LAB_0010cbf1;
          }
          *(undefined4 *)((long)__ptr + (ulong)uVar6 * 4) = 1;
          uVar11 = uVar11 + 1;
          if (uVar9 == uVar11) {
            if (0 < (int)uVar7) {
              lVar12 = __nmemb << 4;
              do {
                uVar9 = __nmemb - 1;
                if (*(int *)((long)__ptr + __nmemb * 4 + -4) != 0) {
                  if (2 < g_debug) {
                    disp_nifti1_extension("+d removing ext: ",nim->ext_list + uVar9,-1);
                  }
                  pcVar10 = nim->ext_list[uVar9].edata;
                  if (pcVar10 != (char *)0x0) {
                    free(pcVar10);
                  }
                  iVar5 = nim->num_ext;
                  if ((long)__nmemb < (long)iVar5) {
                    uVar11 = __nmemb & 0xffffffff;
                    lVar8 = lVar12;
                    do {
                      puVar1 = (undefined8 *)((long)&nim->ext_list->esize + lVar8);
                      uVar4 = puVar1[1];
                      puVar2 = (undefined8 *)((long)&nim->ext_list[-1].esize + lVar8);
                      *puVar2 = *puVar1;
                      puVar2[1] = uVar4;
                      iVar5 = nim->num_ext;
                      lVar8 = lVar8 + 0x10;
                      uVar7 = (int)uVar11 + 1;
                      uVar11 = (ulong)uVar7;
                    } while ((int)uVar7 < iVar5);
                  }
                  nim->num_ext = iVar5 + -1;
                }
                lVar12 = lVar12 + -0x10;
                bVar3 = 1 < (long)__nmemb;
                __nmemb = uVar9;
              } while (bVar3);
            }
            if (3 < g_debug) {
              remove_ext_list_cold_1();
            }
            if (nim->num_ext == 0) {
              if (1 < g_debug) {
                remove_ext_list_cold_2();
              }
              free(nim->ext_list);
              nim->ext_list = (nifti1_extension *)0x0;
            }
            free(__ptr);
            return 0;
          }
        }
        fprintf(_stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",uVar11 & 0xffffffff,
                (ulong)uVar6,(ulong)(uVar7 - 1),nim->fname);
LAB_0010cbf1:
        free(__ptr);
        return -1;
      }
      pcVar10 = "** failed to alloc %d marks\n";
      uVar9 = (ulong)uVar7;
    }
    fprintf(_stderr,pcVar10,uVar9);
  }
  return -1;
}

Assistant:

int remove_ext_list( nifti_image * nim, char ** elist, int len )
{
   int * marks;
   int   c, ec, extval;

   if( len > nim->num_ext ){
      fprintf(stderr, "** cannot remove %d exts from image '%s' with only %d\n",
              len, nim->fname, nim->num_ext);
      return -1;
   }

   if( len <= 0 ){
      fprintf(stderr,"** REL: (%d) no extensions to remove?\n",len);
      return -1;
   }

   extval = atoi(elist[0]);  /* check the first value */

   /* first special case, elist[0] == -1 */
   if( extval == -1 )
   {
      if( g_debug > 1 )
          fprintf(stderr,"+d removing ALL (%d) extensions from '%s'\n",
                  nim->num_ext, nim->fname );
      nifti_free_extensions(nim);
      return 0;
   }

   if( g_debug > 2 )
      fprintf(stderr,"+d removing %d exts from '%s'\n", len, nim->fname );

   if( ! (marks = (int *)calloc(nim->num_ext, sizeof(int))) ) {
      fprintf(stderr,"** failed to alloc %d marks\n",nim->num_ext);
      return -1;
   }

   /* mark all extensions for removal */
   for( ec = 0; ec < len; ec++ )
   {
      extval = atoi(elist[ec]);

      if( extval < 0 || extval >= nim->num_ext ){
         fprintf(stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",
                 ec, extval, nim->num_ext-1, nim->fname);
         free(marks); return -1;
      }

      if( marks[extval] ){
         fprintf(stderr,"** ext #%d (= %d) is a duplicate", ec, extval);
         free(marks); return -1;
      }

      marks[extval]++;
   }

   /* now remove them - count from top down to do lazy programming */
   for( ec = nim->num_ext-1; ec >= 0; ec-- )
   {
      if( !marks[ec] ) continue;   /* do not delete this one */

      if( g_debug > 2 )
         disp_nifti1_extension("+d removing ext: ",nim->ext_list+ec,-1);

      /* delete this data, and shift the list down (yeah, inefficient) */
      if( nim->ext_list[ec].edata ) free( nim->ext_list[ec].edata );

      /* move anything above down one */
      for( c = ec+1; c < nim->num_ext; c++ )
         nim->ext_list[c-1] = nim->ext_list[c];

      nim->num_ext--;
   }

   if( g_debug > 3 ) fprintf(stderr,"-d done removing extensions\n");

   if( nim->num_ext == 0 ){  /* did we trash the only extension? */
      if( g_debug > 1 )
         fprintf(stderr,"-d removed ALL extensions from %s\n",nim->fname);
      free(nim->ext_list);
      nim->ext_list = NULL;
   }

   free(marks);
   return 0;
}